

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::Compiler::get_work_group_size_specialization_constants
          (Compiler *this,SpecializationConstant *x,SpecializationConstant *y,
          SpecializationConstant *z)

{
  _Hash_node_base *p_Var1;
  uint32_t uVar2;
  __node_base_ptr p_Var3;
  ulong uVar4;
  SPIRConstant *pSVar5;
  
  uVar4 = (ulong)(this->ir).default_entry_point.id;
  p_Var3 = ::std::
           _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      uVar4 % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,uVar4);
  p_Var1 = p_Var3->_M_nxt;
  x->id = 0;
  x->constant_id = 0;
  y->id = 0;
  y->constant_id = 0;
  z->id = 0;
  z->constant_id = 0;
  uVar4 = (ulong)*(uint *)((long)&p_Var1[0x1b]._M_nxt + 4);
  if (uVar4 != 0) {
    pSVar5 = Variant::get<spirv_cross::SPIRConstant>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
    uVar2 = (pSVar5->m).c[0].id[0].id;
    if (uVar2 != 0) {
      (x->id).id = uVar2;
      uVar2 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar5->m).c[0].id[0].id,DecorationSpecId);
      x->constant_id = uVar2;
    }
    uVar2 = (pSVar5->m).c[0].id[1].id;
    if (uVar2 != 0) {
      (y->id).id = uVar2;
      uVar2 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar5->m).c[0].id[1].id,DecorationSpecId);
      y->constant_id = uVar2;
    }
    uVar2 = (pSVar5->m).c[0].id[2].id;
    if (uVar2 != 0) {
      (z->id).id = uVar2;
      uVar2 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar5->m).c[0].id[2].id,DecorationSpecId);
      z->constant_id = uVar2;
    }
  }
  return *(uint32_t *)((long)&p_Var1[0x1b]._M_nxt + 4);
}

Assistant:

uint32_t Compiler::get_work_group_size_specialization_constants(SpecializationConstant &x, SpecializationConstant &y,
                                                                SpecializationConstant &z) const
{
	auto &execution = get_entry_point();
	x = { 0, 0 };
	y = { 0, 0 };
	z = { 0, 0 };

	if (execution.workgroup_size.constant != 0)
	{
		auto &c = get<SPIRConstant>(execution.workgroup_size.constant);

		if (c.m.c[0].id[0] != ID(0))
		{
			x.id = c.m.c[0].id[0];
			x.constant_id = get_decoration(c.m.c[0].id[0], DecorationSpecId);
		}

		if (c.m.c[0].id[1] != ID(0))
		{
			y.id = c.m.c[0].id[1];
			y.constant_id = get_decoration(c.m.c[0].id[1], DecorationSpecId);
		}

		if (c.m.c[0].id[2] != ID(0))
		{
			z.id = c.m.c[0].id[2];
			z.constant_id = get_decoration(c.m.c[0].id[2], DecorationSpecId);
		}
	}

	return execution.workgroup_size.constant;
}